

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O3

int_t dmemory_usage(int_t nzlmax,int_t nzumax,int_t nzlumax,int n)

{
  return nzlmax * 4 + nzumax * 0xc + nzlumax * 8 + n * 0x28;
}

Assistant:

int_t dmemory_usage(const int_t nzlmax, const int_t nzumax,
		  const int_t nzlumax, const int n)
{
    register int iword, liword, dword;

    iword   = sizeof(int);
    liword  = sizeof(int_t);
    dword   = sizeof(double);
    
    return (10 * n * iword +
	    nzlmax * liword + nzumax * (liword + dword) + nzlumax * dword);

}